

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>::
ConvertToStruct(vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>
               *this)

{
  bool bVar1;
  undefined1 local_190 [8];
  FundSelectUtxoDataStruct data;
  FundSelectUtxoData *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>
  *this_local;
  vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::FundSelectUtxoData>).
                    super_vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
                  );
  element = (FundSelectUtxoData *)
            std::
            vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::FundSelectUtxoData>).
                   super_vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::FundSelectUtxoData_*,_std::vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::FundSelectUtxoData_*,_std::vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>_>
                 ::operator*(&__end0);
    js::api::json::FundSelectUtxoData::ConvertToStruct
              ((FundSelectUtxoDataStruct *)local_190,
               (FundSelectUtxoData *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_190);
    js::api::FundSelectUtxoDataStruct::~FundSelectUtxoDataStruct
              ((FundSelectUtxoDataStruct *)local_190);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::FundSelectUtxoData_*,_std::vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }